

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS
ref_collapse_edge_normdev(REF_GRID_conflict ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE pRVar1;
  REF_GEOM pRVar2;
  REF_CELL pRVar3;
  REF_ADJ pRVar4;
  REF_ADJ_ITEM pRVar5;
  bool bVar6;
  REF_GRID_conflict pRVar7;
  uint uVar8;
  REF_STATUS RVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  REF_INT RVar17;
  char *pcVar18;
  REF_BOOL supported;
  uint local_184;
  REF_BOOL *local_180;
  REF_GEOM local_178;
  REF_BOOL node0_support;
  REF_GRID_conflict local_168;
  REF_BOOL node1_support;
  ulong local_158;
  REF_NODE local_150;
  ulong local_148;
  REF_DBL new_uv_area;
  REF_DBL orig_uv_area;
  REF_DBL sign_uv_area;
  REF_DBL new_dev;
  REF_DBL orig_dev;
  REF_INT nodes [27];
  REF_INT new_nodes [27];
  
  pRVar1 = ref_grid->node;
  pRVar2 = ref_grid->geom;
  local_184 = node1;
  uVar8 = ref_geom_supported(pRVar2,node0,&node0_support);
  if (uVar8 == 0) {
    local_150 = pRVar1;
    uVar8 = ref_geom_supported(pRVar2,local_184,&node1_support);
    if (uVar8 == 0) {
      if ((((pRVar2->model == (void *)0x0) && (pRVar2->meshlink == (void *)0x0)) ||
          (node0_support == 0)) || (node1_support == 0)) {
        *allowed = 1;
        return 0;
      }
      *allowed = 0;
      pRVar3 = ref_grid->cell[3];
      local_158 = (ulong)local_184;
      uVar11 = 0xffffffff;
      RVar17 = -1;
      if (-1 < (int)local_184) {
        pRVar4 = pRVar3->ref_adj;
        uVar11 = 0xffffffff;
        RVar17 = -1;
        if ((int)local_184 < pRVar4->nnode) {
          uVar8 = pRVar4->first[local_158];
          uVar11 = 0xffffffff;
          RVar17 = -1;
          if ((long)(int)uVar8 != -1) {
            RVar17 = pRVar4->item[(int)uVar8].ref;
            uVar11 = (ulong)uVar8;
          }
        }
      }
      local_180 = allowed;
      local_178 = pRVar2;
      local_168 = ref_grid;
      while ((int)uVar11 != -1) {
        local_148 = uVar11;
        uVar8 = ref_cell_nodes(pRVar3,RVar17,nodes);
        if (uVar8 != 0) {
          pcVar18 = "nodes";
          uVar14 = 0x3b8;
          goto LAB_001e03bb;
        }
        uVar8 = ref_geom_tri_supported(local_178,nodes,&supported);
        if (uVar8 != 0) {
          pcVar18 = "tri support";
          uVar14 = 0x3ba;
          goto LAB_001e03bb;
        }
        if (supported != 0) {
          uVar8 = pRVar3->node_per;
          uVar11 = 0;
          uVar15 = 0;
          if (0 < (int)uVar8) {
            uVar15 = (ulong)uVar8;
          }
          bVar6 = false;
          for (; uVar15 != uVar11; uVar11 = uVar11 + 1) {
            if (nodes[uVar11] == node0) {
              bVar6 = true;
            }
          }
          if (!bVar6) {
            for (lVar12 = 0; lVar10 = (long)(int)uVar8, lVar12 < lVar10; lVar12 = lVar12 + 1) {
              uVar8 = nodes[lVar12];
              if (nodes[lVar12] == local_184) {
                uVar8 = node0;
              }
              new_nodes[lVar12] = uVar8;
              uVar8 = pRVar3->node_per;
            }
            new_nodes[lVar10] = nodes[lVar10];
            uVar8 = ref_geom_cell_tuv_supported(local_178,nodes,2,&supported);
            if (uVar8 != 0) {
              pcVar18 = "tuv support for original configuration";
              uVar14 = 0x3cc;
              goto LAB_001e03bb;
            }
            if (supported == 0) {
              uVar14 = 0x3ce;
              goto LAB_001e05e3;
            }
            uVar8 = ref_geom_tri_norm_deviation(local_168,nodes,&orig_dev);
            if (uVar8 != 0) {
              pcVar18 = "orig";
              uVar14 = 0x3cf;
              goto LAB_001e03bb;
            }
            uVar8 = ref_geom_cell_tuv_supported(local_178,new_nodes,2,&supported);
            pRVar7 = local_168;
            if (uVar8 != 0) {
              pcVar18 = "tuv support for swapped configuration";
              uVar14 = 0x3d2;
              goto LAB_001e03bb;
            }
            if (((supported == 0) ||
                (RVar9 = ref_geom_tri_norm_deviation(local_168,new_nodes,&new_dev), RVar9 != 0)) ||
               ((new_dev < pRVar7->adapt->post_min_normdev && (new_dev < orig_dev))))
            goto LAB_001e0335;
          }
        }
        pRVar5 = pRVar3->ref_adj->item;
        uVar11 = (ulong)pRVar5[(int)local_148].next;
        RVar17 = -1;
        if (uVar11 != 0xffffffffffffffff) {
          RVar17 = pRVar5[uVar11].ref;
        }
      }
      if (local_168->geom->meshlink == (void *)0x0) {
        pRVar3 = local_168->cell[3];
        uVar11 = 0xffffffff;
        RVar17 = -1;
        uVar13 = local_184;
        if (-1 < (int)local_184) {
          pRVar4 = pRVar3->ref_adj;
          uVar11 = 0xffffffff;
          RVar17 = -1;
          if ((int)local_184 < pRVar4->nnode) {
            uVar8 = pRVar4->first[local_158];
            uVar11 = 0xffffffff;
            RVar17 = -1;
            if ((long)(int)uVar8 != -1) {
              RVar17 = pRVar4->item[(int)uVar8].ref;
              uVar11 = (ulong)uVar8;
            }
          }
        }
        while ((int)uVar11 != -1) {
          uVar8 = ref_cell_nodes(pRVar3,RVar17,nodes);
          if (uVar8 != 0) {
            pcVar18 = "nodes";
            uVar14 = 0x3ec;
            goto LAB_001e03bb;
          }
          uVar8 = pRVar3->node_per;
          uVar15 = 0;
          uVar16 = 0;
          if (0 < (int)uVar8) {
            uVar16 = (ulong)uVar8;
          }
          bVar6 = false;
          for (; uVar16 != uVar15; uVar15 = uVar15 + 1) {
            if (nodes[uVar15] == node0) {
              bVar6 = true;
            }
          }
          if (!bVar6) {
            for (lVar12 = 0; lVar10 = (long)(int)uVar8, lVar12 < lVar10; lVar12 = lVar12 + 1) {
              uVar8 = nodes[lVar12];
              if (nodes[lVar12] == uVar13) {
                uVar8 = node0;
              }
              new_nodes[lVar12] = uVar8;
              uVar8 = pRVar3->node_per;
            }
            new_nodes[lVar10] = nodes[lVar10];
            uVar8 = ref_geom_cell_tuv_supported(local_178,nodes,2,&supported);
            if (uVar8 != 0) {
              pcVar18 = "tuv support for original configuration";
              uVar14 = 0x3fe;
LAB_001e03bb:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,uVar14,"ref_collapse_edge_normdev",(ulong)uVar8,pcVar18);
              return uVar8;
            }
            if (supported == 0) {
              uVar14 = 0x400;
LAB_001e05e3:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,uVar14,"ref_collapse_edge_normdev",
                     "original configuration before collapse does not support cell tuv");
              return 1;
            }
            uVar8 = ref_geom_cell_tuv_supported(local_178,new_nodes,2,&supported);
            if (uVar8 != 0) {
              pcVar18 = "tuv support for swapped configuration";
              uVar14 = 0x403;
              goto LAB_001e03bb;
            }
            if (supported == 0) {
LAB_001e0335:
              *local_180 = 0;
              return 0;
            }
            uVar8 = ref_geom_uv_area_sign(local_168,nodes[pRVar3->node_per],&sign_uv_area);
            pRVar2 = local_178;
            if (uVar8 != 0) {
              pcVar18 = "sign";
              uVar14 = 0x40a;
              goto LAB_001e03bb;
            }
            uVar8 = ref_geom_uv_area(local_178,nodes,&orig_uv_area);
            if (uVar8 != 0) {
              pcVar18 = "uv area";
              uVar14 = 0x40b;
              goto LAB_001e03bb;
            }
            uVar8 = ref_geom_uv_area(pRVar2,new_nodes,&new_uv_area);
            if (uVar8 != 0) {
              pcVar18 = "uv area";
              uVar14 = 0x40c;
              goto LAB_001e03bb;
            }
            uVar13 = local_184;
            if ((new_uv_area * sign_uv_area <= local_150->min_uv_area) &&
               (new_uv_area * sign_uv_area < sign_uv_area * orig_uv_area)) goto LAB_001e0335;
          }
          pRVar5 = pRVar3->ref_adj->item;
          uVar11 = (ulong)pRVar5[(int)uVar11].next;
          RVar17 = -1;
          if (uVar11 != 0xffffffffffffffff) {
            RVar17 = pRVar5[uVar11].ref;
          }
        }
      }
      *local_180 = 1;
      return 0;
    }
    pcVar18 = "support1";
    uVar14 = 0x3ad;
  }
  else {
    pcVar18 = "support0";
    uVar14 = 0x3ac;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",uVar14
         ,"ref_collapse_edge_normdev",(ulong)uVar8,pcVar18);
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_normdev(REF_GRID ref_grid, REF_INT node0,
                                             REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell;
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed;

  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_BOOL node0_support, node1_support, supported;
  REF_DBL orig_dev, new_dev;
  REF_DBL sign_uv_area, orig_uv_area, new_uv_area;

  RSS(ref_geom_supported(ref_geom, node0, &node0_support), "support0");
  RSS(ref_geom_supported(ref_geom, node1, &node1_support), "support1");
  if (!(ref_geom_model_loaded(ref_geom) || ref_geom_meshlinked(ref_geom)) ||
      !node0_support || !node1_support) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (!supported) continue; /* no geom support, check by same normal */

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      new_nodes[node] = nodes[node];
      if (node1 == new_nodes[node]) new_nodes[node] = node0;
    }
    new_nodes[ref_cell_node_per(ref_cell)] = nodes[ref_cell_node_per(ref_cell)];

    RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
        "tuv support for original configuration");
    RAS(supported,
        "original configuration before collapse does not support cell tuv");
    RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &orig_dev), "orig");
    RSS(ref_geom_cell_tuv_supported(ref_geom, new_nodes, REF_GEOM_FACE,
                                    &supported),
        "tuv support for swapped configuration");
    if (!supported) { /* abort collapse, cell tuv not supported */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    if (REF_SUCCESS !=
        ref_geom_tri_norm_deviation(ref_grid, new_nodes, &new_dev)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    /* allow if improvement */
    if ((new_dev < ref_grid_adapt(ref_grid, post_min_normdev)) &&
        (new_dev < orig_dev)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  /* skip uv checks for meshlink */
  if (ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      new_nodes[node] = nodes[node];
      if (node1 == new_nodes[node]) new_nodes[node] = node0;
    }
    new_nodes[ref_cell_node_per(ref_cell)] = nodes[ref_cell_node_per(ref_cell)];

    /* see if new config is below limit */
    RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
        "tuv support for original configuration");
    RAS(supported,
        "original configuration before collapse does not support cell tuv");
    RSS(ref_geom_cell_tuv_supported(ref_geom, new_nodes, REF_GEOM_FACE,
                                    &supported),
        "tuv support for swapped configuration");
    if (!supported) { /* abort collapse, cell tuv not supported */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    RSS(ref_geom_uv_area_sign(ref_grid, nodes[ref_cell_node_per(ref_cell)],
                              &sign_uv_area),
        "sign");
    RSS(ref_geom_uv_area(ref_geom, nodes, &orig_uv_area), "uv area");
    RSS(ref_geom_uv_area(ref_geom, new_nodes, &new_uv_area), "uv area");
    /* allow if improvement */
    if ((sign_uv_area * new_uv_area <= ref_node_min_uv_area(ref_node)) &&
        (sign_uv_area * new_uv_area < sign_uv_area * orig_uv_area)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}